

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btKinematicCharacterController.cpp
# Opt level: O0

void __thiscall
btKinematicCharacterController::stepForwardAndStrafe
          (btKinematicCharacterController *this,btCollisionWorld *collisionWorld,btVector3 *walkMove
          )

{
  int iVar1;
  bool bVar2;
  btPairCachingGhostObject *pbVar3;
  btBroadphaseProxy *pbVar4;
  btCollisionWorld *in_RSI;
  btKinematicCharacterController *in_RDI;
  float extraout_XMM0_Da;
  undefined4 uVar5;
  undefined4 uVar6;
  btVector3 bVar7;
  btScalar in_stack_0000001c;
  ConvexResultCallback *in_stack_00000020;
  btTransform *in_stack_00000028;
  btTransform *in_stack_00000030;
  btConvexShape *in_stack_00000038;
  btCollisionWorld *in_stack_00000040;
  btVector3 currentDir;
  btScalar margin;
  btKinematicClosestNotMeConvexResultCallback callback;
  btVector3 sweepDirNegative;
  int maxIter;
  btScalar distance2;
  btScalar fraction;
  btTransform end;
  btTransform start;
  btScalar in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined1 in_stack_fffffffffffffdd8 [16];
  btConvexShape *in_stack_fffffffffffffe08;
  btDispatcherInfo *in_stack_fffffffffffffe10;
  btPairCachingGhostObject *in_stack_fffffffffffffe18;
  btKinematicClosestNotMeConvexResultCallback *in_stack_fffffffffffffe20;
  undefined1 *puVar8;
  btVector3 *hitNormal;
  btKinematicCharacterController *this_00;
  int local_174;
  btVector3 local_170;
  float local_160;
  ConvexResultCallback local_150 [7];
  undefined8 local_d4;
  undefined8 local_cc;
  int local_c4;
  undefined8 local_c0;
  undefined8 local_b8;
  btScalar local_b0;
  float local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  btVector3 local_98 [2];
  btScalar in_stack_ffffffffffffff8c;
  ConvexResultCallback *in_stack_ffffffffffffff90;
  btTransform *in_stack_ffffffffffffff98;
  btTransform *in_stack_ffffffffffffffa0;
  btConvexShape *in_stack_ffffffffffffffa8;
  btGhostObject *in_stack_ffffffffffffffb0;
  
  puVar8 = &stack0xffffffffffffffa8;
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  hitNormal = local_98;
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  this_00 = (btKinematicCharacterController *)&in_RDI->m_currentPosition;
  bVar7 = operator+(in_stack_fffffffffffffdd8._8_8_,in_stack_fffffffffffffdd8._0_8_);
  local_a8 = bVar7.m_floats._0_8_;
  uStack_a0 = bVar7.m_floats._8_8_;
  *(undefined8 *)(in_RDI->m_targetPosition).m_floats = local_a8;
  *(undefined8 *)((in_RDI->m_targetPosition).m_floats + 2) = uStack_a0;
  btTransform::setIdentity(in_stack_fffffffffffffdd8._8_8_);
  btTransform::setIdentity(in_stack_fffffffffffffdd8._8_8_);
  local_ac = 1.0;
  bVar7 = operator-(in_stack_fffffffffffffdd8._8_8_,in_stack_fffffffffffffdd8._0_8_);
  local_c0 = bVar7.m_floats._0_8_;
  local_b8 = bVar7.m_floats._8_8_;
  local_b0 = btVector3::length2((btVector3 *)0x1f569b);
  if ((in_RDI->m_touchingContact & 1U) != 0) {
    btVector3::dot(&in_RDI->m_normalizedDirection,&in_RDI->m_touchingNormal);
  }
  local_c4 = 10;
  do {
    iVar1 = local_c4;
    if (0.01 < local_ac) {
      local_c4 = local_c4 + -1;
    }
    if (0.01 >= local_ac || iVar1 < 1) {
      return;
    }
    btTransform::setOrigin((btTransform *)&stack0xffffffffffffffa8,&in_RDI->m_currentPosition);
    btTransform::setOrigin((btTransform *)local_98,&in_RDI->m_targetPosition);
    bVar7 = operator-(in_stack_fffffffffffffdd8._8_8_,in_stack_fffffffffffffdd8._0_8_);
    local_d4 = bVar7.m_floats._0_8_;
    local_cc = bVar7.m_floats._8_8_;
    btKinematicClosestNotMeConvexResultCallback::btKinematicClosestNotMeConvexResultCallback
              (in_stack_fffffffffffffe20,(btCollisionObject *)in_stack_fffffffffffffe18,
               (btVector3 *)in_stack_fffffffffffffe10,
               (btScalar)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    pbVar3 = getGhostObject(in_RDI);
    pbVar4 = btCollisionObject::getBroadphaseHandle((btCollisionObject *)pbVar3);
    local_150[0].m_collisionFilterGroup = pbVar4->m_collisionFilterGroup;
    pbVar3 = getGhostObject(in_RDI);
    pbVar4 = btCollisionObject::getBroadphaseHandle((btCollisionObject *)pbVar3);
    local_150[0].m_collisionFilterMask = pbVar4->m_collisionFilterMask;
    (*(in_RDI->m_convexShape->super_btCollisionShape)._vptr_btCollisionShape[0xc])();
    local_160 = extraout_XMM0_Da;
    (*(in_RDI->m_convexShape->super_btCollisionShape)._vptr_btCollisionShape[0xb])
              (extraout_XMM0_Da + in_RDI->m_addedMargin);
    if ((in_RDI->m_useGhostObjectSweepTest & 1U) == 0) {
      in_stack_fffffffffffffe08 = in_RDI->m_convexShape;
      in_stack_fffffffffffffe10 = btCollisionWorld::getDispatchInfo(in_RSI);
      btCollisionWorld::convexSweepTest
                (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
                 in_stack_00000020,in_stack_0000001c);
    }
    else {
      in_stack_fffffffffffffe18 = in_RDI->m_ghostObject;
      in_stack_fffffffffffffe20 =
           (btKinematicClosestNotMeConvexResultCallback *)in_RDI->m_convexShape;
      btCollisionWorld::getDispatchInfo(in_RSI);
      btGhostObject::convexSweepTest
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    (*(in_RDI->m_convexShape->super_btCollisionShape)._vptr_btCollisionShape[0xb])(local_160);
    local_ac = local_ac - local_150[0].m_closestHitFraction;
    bVar2 = btCollisionWorld::ConvexResultCallback::hasHit(local_150);
    if (bVar2) {
      uVar5 = 0;
      uVar6 = 0;
      updateTargetPositionBasedOnCollision
                (this_00,hitNormal,(btScalar)((ulong)puVar8 >> 0x20),SUB84(puVar8,0));
      bVar7 = operator-(in_stack_fffffffffffffdd8._8_8_,in_stack_fffffffffffffdd8._0_8_);
      local_170.m_floats._8_8_ = bVar7.m_floats._8_8_;
      in_stack_fffffffffffffdd8._8_4_ = uVar5;
      in_stack_fffffffffffffdd8._0_4_ = local_170.m_floats[2];
      in_stack_fffffffffffffdd8._4_4_ = local_170.m_floats[3];
      in_stack_fffffffffffffdd8._12_4_ = uVar6;
      local_170.m_floats._0_8_ = bVar7.m_floats._0_8_;
      local_b0 = btVector3::length2((btVector3 *)0x1f5a40);
      if (local_b0 <= 1.1920929e-07) {
        local_174 = 3;
      }
      else {
        btVector3::normalize((btVector3 *)CONCAT44(local_b0,in_stack_fffffffffffffdd0));
        in_stack_fffffffffffffdd0 = btVector3::dot(&local_170,&in_RDI->m_normalizedDirection);
        if (0.0 < in_stack_fffffffffffffdd0) goto LAB_001f5ae7;
        local_174 = 3;
      }
    }
    else {
      *(undefined8 *)(in_RDI->m_currentPosition).m_floats =
           *(undefined8 *)(in_RDI->m_targetPosition).m_floats;
      *(undefined8 *)((in_RDI->m_currentPosition).m_floats + 2) =
           *(undefined8 *)((in_RDI->m_targetPosition).m_floats + 2);
LAB_001f5ae7:
      local_174 = 0;
    }
    btKinematicClosestNotMeConvexResultCallback::~btKinematicClosestNotMeConvexResultCallback
              ((btKinematicClosestNotMeConvexResultCallback *)0x1f5aff);
    if (local_174 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void btKinematicCharacterController::stepForwardAndStrafe ( btCollisionWorld* collisionWorld, const btVector3& walkMove)
{
	// printf("m_normalizedDirection=%f,%f,%f\n",
	// 	m_normalizedDirection[0],m_normalizedDirection[1],m_normalizedDirection[2]);
	// phase 2: forward and strafe
	btTransform start, end;
	m_targetPosition = m_currentPosition + walkMove;

	start.setIdentity ();
	end.setIdentity ();

	btScalar fraction = 1.0;
	btScalar distance2 = (m_currentPosition-m_targetPosition).length2();
//	printf("distance2=%f\n",distance2);

	if (m_touchingContact)
	{
		if (m_normalizedDirection.dot(m_touchingNormal) > btScalar(0.0))
		{
			//interferes with step movement
			//updateTargetPositionBasedOnCollision (m_touchingNormal);
		}
	}

	int maxIter = 10;

	while (fraction > btScalar(0.01) && maxIter-- > 0)
	{
		start.setOrigin (m_currentPosition);
		end.setOrigin (m_targetPosition);
		btVector3 sweepDirNegative(m_currentPosition - m_targetPosition);

		btKinematicClosestNotMeConvexResultCallback callback (m_ghostObject, sweepDirNegative, btScalar(0.0));
		callback.m_collisionFilterGroup = getGhostObject()->getBroadphaseHandle()->m_collisionFilterGroup;
		callback.m_collisionFilterMask = getGhostObject()->getBroadphaseHandle()->m_collisionFilterMask;


		btScalar margin = m_convexShape->getMargin();
		m_convexShape->setMargin(margin + m_addedMargin);


		if (m_useGhostObjectSweepTest)
		{
			m_ghostObject->convexSweepTest (m_convexShape, start, end, callback, collisionWorld->getDispatchInfo().m_allowedCcdPenetration);
		} else
		{
			collisionWorld->convexSweepTest (m_convexShape, start, end, callback, collisionWorld->getDispatchInfo().m_allowedCcdPenetration);
		}

		m_convexShape->setMargin(margin);


		fraction -= callback.m_closestHitFraction;

		if (callback.hasHit())
		{
			// we moved only a fraction
			//btScalar hitDistance;
			//hitDistance = (callback.m_hitPointWorld - m_currentPosition).length();

//			m_currentPosition.setInterpolate3 (m_currentPosition, m_targetPosition, callback.m_closestHitFraction);

			updateTargetPositionBasedOnCollision (callback.m_hitNormalWorld);
			btVector3 currentDir = m_targetPosition - m_currentPosition;
			distance2 = currentDir.length2();
			if (distance2 > SIMD_EPSILON)
			{
				currentDir.normalize();
				/* See Quake2: "If velocity is against original velocity, stop ead to avoid tiny oscilations in sloping corners." */
				if (currentDir.dot(m_normalizedDirection) <= btScalar(0.0))
				{
					break;
				}
			} else
			{
//				printf("currentDir: don't normalize a zero vector\n");
				break;
			}

		} else {
			// we moved whole way
			m_currentPosition = m_targetPosition;
		}

	//	if (callback.m_closestHitFraction == 0.f)
	//		break;

	}
}